

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadIndexData(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  size_t sVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pElement;
  ulong uVar9;
  ulong pNumPrimitives;
  PrimitiveType local_268;
  allocator local_255;
  int local_254;
  ulong local_250;
  char *content;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> perIndexData
  ;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vcount;
  string elementName;
  SubMesh subgroup;
  string local_1a8 [11];
  
  vcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perIndexData.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  perIndexData.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  perIndexData.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = GetAttribute(this,"count");
  local_254 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar6);
  uVar6 = TestAttribute(this,"material");
  subgroup.mMaterial._M_dataplus._M_p = (pointer)&subgroup.mMaterial.field_2;
  subgroup.mMaterial._M_string_length = 0;
  subgroup.mMaterial.field_2._M_local_buf[0] = '\0';
  if (-1 < (int)uVar6) {
    (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
    std::__cxx11::string::assign((char *)&subgroup);
  }
  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string
            ((string *)&elementName,(char *)CONCAT44(extraout_var,iVar7),(allocator *)local_1a8);
  bVar3 = IsElement(this,"lines");
  if (bVar3) {
    local_268 = Prim_Lines;
    goto LAB_003eb173;
  }
  bVar4 = IsElement(this,"linestrips");
  if (bVar4) {
    local_268 = Prim_LineStrip;
    bVar2 = true;
    bVar4 = false;
    bVar1 = false;
    goto LAB_003eb1c4;
  }
  bVar4 = IsElement(this,"polygons");
  if (bVar4) {
    local_268 = Prim_Polygon;
LAB_003eb173:
    bVar4 = false;
LAB_003eb17f:
    bVar1 = false;
  }
  else {
    bVar4 = IsElement(this,"polylist");
    if (bVar4) {
      local_268 = Prim_Polylist;
      goto LAB_003eb173;
    }
    bVar4 = IsElement(this,"triangles");
    if (bVar4) {
      local_268 = Prim_Triangles;
      goto LAB_003eb173;
    }
    bVar4 = IsElement(this,"trifans");
    if (bVar4) {
      local_268 = Prim_TriFans;
      bVar4 = true;
      goto LAB_003eb17f;
    }
    bVar4 = IsElement(this,"tristrips");
    if (!bVar4) {
      __assert_fail("primType != Prim_Invalid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                    ,0x934,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
    }
    local_268 = Prim_TriStrips;
    bVar1 = true;
    bVar4 = false;
  }
  bVar2 = false;
LAB_003eb1c4:
  pNumPrimitives = (ulong)local_254;
  local_250 = 0;
  do {
    while( true ) {
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar7 == '\0') goto LAB_003eb391;
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar7 != 1) break;
      bVar5 = IsElement(this,"input");
      if (bVar5) {
        ReadInputChannel(this,&perIndexData);
      }
      else {
        bVar5 = IsElement(this,"vcount");
        if (bVar5) {
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar7 == '\0') {
            if (local_254 != 0) {
              content = GetTextContent(this);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                        (&vcount,pNumPrimitives);
              for (uVar9 = 0; uVar9 < pNumPrimitives; uVar9 = (ulong)((int)uVar9 + 1)) {
                if (*content == '\0') {
                  std::__cxx11::string::string
                            ((string *)local_1a8,
                             "Expected more values while reading <vcount> contents.",&local_255);
                  ThrowException(this,local_1a8);
                }
                uVar6 = strtoul10(content,&content);
                local_1a8[0]._M_dataplus._M_p = (pointer)(ulong)uVar6;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&vcount,(unsigned_long *)local_1a8);
                SkipSpacesAndLineEnd<char>(&content);
              }
            }
            TestClosing(this,"vcount");
          }
        }
        else {
          bVar5 = IsElement(this,"p");
          if (bVar5) {
            iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((char)iVar7 == '\0') {
              sVar8 = ReadPrimitives(this,pMesh,&perIndexData,pNumPrimitives,&vcount,local_268);
              local_250 = local_250 + sVar8;
            }
          }
          else {
            bVar5 = IsElement(this,"extra");
            pElement = "extra";
            if (!bVar5) {
              bVar5 = IsElement(this,"ph");
              pElement = "ph";
              if (!bVar5) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::operator<<((ostream *)local_1a8,"Unexpected sub element <");
                iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                std::operator<<((ostream *)local_1a8,(char *)CONCAT44(extraout_var_01,iVar7));
                std::operator<<((ostream *)local_1a8,"> in tag <");
                std::operator<<((ostream *)local_1a8,(string *)&elementName);
                std::operator<<((ostream *)local_1a8,">");
                std::__cxx11::stringbuf::str();
                ThrowException(this,(string *)&content);
              }
            }
            SkipElement(this,pElement);
          }
        }
      }
    }
    iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar7 != 2);
  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  bVar5 = std::operator!=((char *)CONCAT44(extraout_var_00,iVar7),&elementName);
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,"Expected end of <");
    std::operator<<((ostream *)local_1a8,(string *)&elementName);
    std::operator<<((ostream *)local_1a8,"> element.");
    std::__cxx11::stringbuf::str();
    ThrowException(this,(string *)&content);
  }
LAB_003eb391:
  if (((!bVar3 && !bVar2) && (!bVar4 && !bVar1)) && (local_250 != pNumPrimitives)) {
    __assert_fail("actualPrimitives == numPrimitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                  ,0x975,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
  }
  subgroup.mNumFaces = local_250;
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::push_back
            (&pMesh->mSubMeshes,&subgroup);
  std::__cxx11::string::~string((string *)&elementName);
  std::__cxx11::string::~string((string *)&subgroup);
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector(&perIndexData);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ColladaParser::ReadIndexData(Mesh* pMesh)
{
    std::vector<size_t> vcount;
    std::vector<InputChannel> perIndexData;

    // read primitive count from the attribute
    int attrCount = GetAttribute("count");
    size_t numPrimitives = (size_t)mReader->getAttributeValueAsInt(attrCount);
    // some mesh types (e.g. tristrips) don't specify primitive count upfront,
    // so we need to sum up the actual number of primitives while we read the <p>-tags
    size_t actualPrimitives = 0;

    // material subgroup
    int attrMaterial = TestAttribute("material");
    SubMesh subgroup;
    if (attrMaterial > -1)
        subgroup.mMaterial = mReader->getAttributeValue(attrMaterial);

    // distinguish between polys and triangles
    std::string elementName = mReader->getNodeName();
    PrimitiveType primType = Prim_Invalid;
    if (IsElement("lines"))
        primType = Prim_Lines;
    else if (IsElement("linestrips"))
        primType = Prim_LineStrip;
    else if (IsElement("polygons"))
        primType = Prim_Polygon;
    else if (IsElement("polylist"))
        primType = Prim_Polylist;
    else if (IsElement("triangles"))
        primType = Prim_Triangles;
    else if (IsElement("trifans"))
        primType = Prim_TriFans;
    else if (IsElement("tristrips"))
        primType = Prim_TriStrips;

    ai_assert(primType != Prim_Invalid);

    // also a number of <input> elements, but in addition a <p> primitive collection and probably index counts for all primitives
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(perIndexData);
            }
            else if (IsElement("vcount"))
            {
                if (!mReader->isEmptyElement())
                {
                    if (numPrimitives)  // It is possible to define a mesh without any primitives
                    {
                        // case <polylist> - specifies the number of indices for each polygon
                        const char* content = GetTextContent();
                        vcount.reserve(numPrimitives);
                        for (unsigned int a = 0; a < numPrimitives; a++)
                        {
                            if (*content == 0)
                                ThrowException("Expected more values while reading <vcount> contents.");
                            // read a number
                            vcount.push_back((size_t)strtoul10(content, &content));
                            // skip whitespace after it
                            SkipSpacesAndLineEnd(&content);
                        }
                    }

                    TestClosing("vcount");
                }
            }
            else if (IsElement("p"))
            {
                if (!mReader->isEmptyElement())
                {
                    // now here the actual fun starts - these are the indices to construct the mesh data from
                    actualPrimitives += ReadPrimitives(pMesh, perIndexData, numPrimitives, vcount, primType);
                }
            }
            else if (IsElement("extra"))
            {
                SkipElement("extra");
            }
            else if (IsElement("ph")) {
                SkipElement("ph");
            }
            else {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <" << elementName << ">");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (mReader->getNodeName() != elementName)
                ThrowException(format() << "Expected end of <" << elementName << "> element.");

            break;
        }
    }

#ifdef ASSIMP_BUILD_DEBUG
    if (primType != Prim_TriFans && primType != Prim_TriStrips && primType != Prim_LineStrip &&
        primType != Prim_Lines) { // this is ONLY to workaround a bug in SketchUp 15.3.331 where it writes the wrong 'count' when it writes out the 'lines'.
        ai_assert(actualPrimitives == numPrimitives);
    }
#endif

    // only when we're done reading all <p> tags (and thus know the final vertex count) can we commit the submesh
    subgroup.mNumFaces = actualPrimitives;
    pMesh->mSubMeshes.push_back(subgroup);
}